

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O3

Mat __thiscall Mat::GaussLin(Mat *this,Mat *rhs,int n)

{
  undefined8 uVar1;
  double dVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  Mat *pMVar7;
  ulong uVar8;
  uint uVar9;
  double *pdVar10;
  uint in_ECX;
  long lVar11;
  undefined4 in_register_00000014;
  int *piVar12;
  long lVar13;
  double *extraout_RDX;
  ulong uVar14;
  ulong uVar15;
  double *pdVar16;
  double *pdVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  int i;
  double dVar23;
  Mat MVar24;
  Mat Aux;
  Mat *X;
  double *local_a8;
  double *local_a0;
  double *local_98;
  Mat local_88;
  ulong local_78;
  Mat *local_70;
  long local_68;
  long local_60;
  ulong local_58;
  ulong local_50;
  double *local_48;
  Mat local_40;
  
  piVar12 = (int *)CONCAT44(in_register_00000014,n);
  local_70 = this;
  Mat(&local_88,rhs);
  pMVar7 = local_70;
  if (local_88.n_rows_ == piVar12[1] * *piVar12) {
    uVar9 = in_ECX - 1;
    uVar15 = (ulong)in_ECX;
    if (1 < (int)in_ECX) {
      lVar11 = (long)local_88.n_cols_;
      iVar3 = rhs->n_cols_;
      lVar13 = (long)iVar3;
      local_58 = (ulong)uVar9;
      lVar4 = *(long *)(piVar12 + 2);
      local_60 = lVar11 * 8 + 8;
      local_68 = lVar13 * 8 + 8;
      local_98 = local_88.v_ + lVar13;
      uVar20 = 1;
      local_a0 = local_88.v_;
      local_a8 = local_88.v_;
      pdVar10 = local_88.v_;
      uVar14 = uVar15;
      uVar22 = 0;
      pdVar16 = local_88.v_ + lVar11;
      do {
        local_48 = pdVar16;
        local_50 = uVar22 + 1;
        uVar19 = uVar22 & 0xffffffff;
        uVar21 = uVar20;
        pdVar16 = local_48;
        do {
          uVar8 = uVar21 & 0xffffffff;
          if (ABS(*pdVar16) <= ABS(local_88.v_[uVar22 + (int)uVar19 * lVar11])) {
            uVar8 = uVar19;
          }
          uVar19 = uVar8;
          uVar21 = uVar21 + 1;
          pdVar16 = pdVar16 + lVar11;
          iVar18 = (int)uVar19;
        } while (uVar15 != uVar21);
        if (uVar22 != uVar19) {
          if (uVar22 < uVar15) {
            uVar21 = 0;
            do {
              dVar23 = local_a0[uVar21];
              pdVar10[uVar21] = local_a8[(long)(iVar3 * iVar18) + uVar21];
              local_a8[(long)(iVar3 * iVar18) + uVar21] = dVar23;
              uVar21 = uVar21 + 1;
            } while (uVar14 != uVar21);
          }
          lVar5 = *(long *)(piVar12 + 2);
          uVar1 = *(undefined8 *)(lVar5 + uVar22 * 8);
          *(undefined8 *)(lVar5 + uVar22 * 8) = *(undefined8 *)(lVar5 + (long)iVar18 * 8);
          *(undefined8 *)(lVar5 + (long)iVar18 * 8) = uVar1;
        }
        pdVar16 = local_98;
        uVar21 = uVar20;
        do {
          dVar23 = local_88.v_[uVar22 + uVar21 * lVar13];
          dVar2 = local_88.v_[(iVar3 + 1) * (int)uVar22];
          local_88.v_[uVar22 + uVar21 * lVar13] = 0.0;
          uVar19 = 1;
          do {
            pdVar16[uVar19] = pdVar10[uVar19] * (-dVar23 / dVar2) + pdVar16[uVar19];
            uVar19 = uVar19 + 1;
          } while (uVar14 != uVar19);
          *(double *)(lVar4 + uVar21 * 8) =
               (-dVar23 / dVar2) * *(double *)(lVar4 + uVar22 * 8) + *(double *)(lVar4 + uVar21 * 8)
          ;
          uVar21 = uVar21 + 1;
          pdVar16 = pdVar16 + lVar13;
        } while (uVar21 != uVar15);
        uVar20 = uVar20 + 1;
        local_a8 = local_a8 + 1;
        pdVar10 = pdVar10 + lVar13 + 1;
        local_a0 = local_a0 + lVar11 + 1;
        uVar14 = uVar14 - 1;
        local_98 = local_98 + lVar13 + 1;
        uVar22 = local_50;
        pdVar16 = local_48 + lVar11 + 1;
      } while (local_50 != local_58);
    }
    local_70->n_rows_ = in_ECX;
    local_70->n_cols_ = 1;
    uVar14 = 0xffffffffffffffff;
    if (-1 < (int)in_ECX) {
      uVar14 = uVar15 * 8;
    }
    local_78 = (ulong)in_ECX;
    pdVar10 = (double *)operator_new__(uVar14);
    pMVar7->v_ = pdVar10;
    if (0 < (int)in_ECX) {
      memset(pdVar10,0,uVar15 * 8);
    }
    iVar3 = rhs->n_cols_;
    lVar4 = *(long *)(piVar12 + 2);
    pdVar10[(int)uVar9] =
         *(double *)(lVar4 + (long)(int)uVar9 * 8) /
         local_88.v_[(long)(int)(iVar3 * uVar9 + in_ECX) + -1];
    if (1 < (int)in_ECX) {
      pdVar16 = local_88.v_ + (long)iVar3 * (ulong)(in_ECX - 2) + uVar15;
      pdVar17 = pdVar10 + uVar15;
      iVar18 = 0;
      uVar14 = (ulong)(in_ECX - 2);
      do {
        dVar23 = 0.0;
        if ((long)uVar14 < (long)(uVar15 - 1)) {
          lVar11 = -1;
          do {
            dVar23 = dVar23 - pdVar16[lVar11] * pdVar17[lVar11];
            lVar11 = lVar11 + 1;
          } while (iVar18 != (int)lVar11);
        }
        pdVar10[uVar14] =
             (dVar23 + *(double *)(lVar4 + uVar14 * 8)) / local_88.v_[(iVar3 + 1) * (int)uVar14];
        pdVar16 = pdVar16 + ~(long)iVar3;
        pdVar17 = pdVar17 + -1;
        iVar18 = iVar18 + 1;
        bVar6 = 0 < (long)uVar14;
        uVar14 = uVar14 - 1;
      } while (bVar6);
    }
    operator~(&local_40);
    if (local_40.v_ != (double *)0x0) {
      operator_delete__(local_40.v_);
    }
    operator_delete__(local_88.v_);
    MVar24.v_ = extraout_RDX;
    MVar24._0_8_ = pMVar7;
    return MVar24;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"ERROR: Invalid dimension in gaussLin",0x24);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  exit(1);
}

Assistant:

Mat Mat::GaussLin(const Mat rhs,int n) const
{
	Mat Aux = (*this);
	if ( (Aux.n_rows_!=rhs.Size() )) {
    cerr << "ERROR: Invalid dimension in gaussLin" << endl;
    exit(1);
	};
	double m;
	for (int k=0; k<n-1; k++ )
	{
		int l=k;
		// Rearrangement
		for (int i=k+1; i<n; i++)
		{
			if (abs(Aux(i,k)) > abs(Aux(l,k))) 
				l=i;
		}
		if (l!=k)
		{
			for (int j = k; j < n; j++)
			{
				m = Aux(k,j);
				Aux.v_[k*n_cols_+j] = Aux.v_[l*n_cols_+j];
				Aux.v_[l*n_cols_+j] = m;
			}
			m = rhs.v_[k];
			rhs.v_[k] = rhs.v_[l];
		    rhs.v_[l] = m;
		}
		for (int i = k+1; i < n; i++)
		{
			m = Aux.v_[i*n_cols_+k] / Aux.v_[k*n_cols_+k];
			Aux.v_[i*n_cols_+k] = 0.0;
			for ( int j = k+1; j < n; j++)
			{
				Aux.v_[i*n_cols_ + j] = Aux.v_[i*n_cols_ + j] - m * Aux.v_[k*n_cols_+j];
			}
			rhs.v_[i] = rhs.v_[i] - m * rhs.v_[k] ; 
		}
	}
	Mat X(n);
	X.v_[n-1] = rhs.v_[n-1] / Aux.v_[(n-1)*n_cols_+n-1];
	for (int i = n-2 ;i >-1 ;i--)
	{
		double s = 0.0;		
		for (int j = i+1 ; j < n; j++)
			s = s - Aux.v_[i*n_cols_ + j] * X.v_[j];
		X.v_[i] = (rhs.v_[i] + s)/ Aux.v_[i*n_cols_ + i];
	}
	~Aux;
	return X;
}